

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall cfd::core::DescriptorNode::AnalyzeKey(DescriptorNode *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  reference pvVar5;
  size_type sVar6;
  long lVar7;
  size_t sVar8;
  undefined8 uVar9;
  Privkey *in_stack_fffffffffffff808;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  string *in_stack_fffffffffffff820;
  pointer *this_00;
  undefined8 in_stack_fffffffffffff828;
  CfdError CVar10;
  CfdException *in_stack_fffffffffffff830;
  CfdException *this_01;
  CfdSourceLocation local_6f0;
  string local_6d8;
  Pubkey local_6b8;
  undefined1 local_69a;
  undefined1 local_699 [33];
  CfdSourceLocation local_678;
  Privkey local_660;
  undefined1 local_639;
  NetType local_638;
  bool local_632;
  bool has_wif;
  NetType nettype;
  bool is_compressed;
  string errmsg;
  CfdException *except;
  Pubkey local_5e8;
  SchnorrPubkey local_5d0;
  string local_5b8;
  undefined1 local_592;
  allocator local_591;
  string local_590 [32];
  CfdSourceLocation local_570;
  ByteData local_558;
  Pubkey local_540;
  undefined1 local_528 [8];
  ByteData bytes;
  Privkey privkey;
  SchnorrPubkey schnorr_pubkey;
  Pubkey pubkey;
  undefined1 local_4b8 [7];
  bool is_wif;
  string local_4a0;
  string local_480;
  ExtPubkey local_460;
  ExtPubkey local_3f0;
  undefined1 local_37a;
  allocator local_379;
  string local_378 [32];
  CfdSourceLocation local_358;
  ByteData256 local_340;
  string local_328;
  string local_308;
  ExtPrivkey local_2e8;
  undefined1 local_270 [8];
  ExtPrivkey xpriv;
  allocator local_1d9;
  string local_1d8 [32];
  CfdSourceLocation local_1b8;
  ulong local_1a0;
  size_t index;
  string local_190 [32];
  undefined1 local_170 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  undefined1 local_150 [7];
  bool hardened;
  string key;
  string path;
  ExtPubkey xpub;
  string local_90 [32];
  string local_70 [8];
  string hdkey_top;
  string local_38 [32];
  long local_18;
  size_type pos;
  DescriptorNode *this_local;
  
  pos = (size_type)this;
  ::std::__cxx11::string::operator=((string *)&this->key_info_,(string *)&this->value_);
  pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)&this->value_);
  if ((*pcVar3 == '[') &&
     (local_18 = ::std::__cxx11::string::find((char *)&this->value_,0x897db9), local_18 != -1)) {
    ::std::__cxx11::string::substr((ulong)local_38,(ulong)&this->value_);
    ::std::__cxx11::string::operator=((string *)&this->key_info_,local_38);
    ::std::__cxx11::string::~string(local_38);
  }
  pcVar3 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
  hdkey_top.field_2._8_8_ = pcVar3 + 1;
  logger::info<std::__cxx11::string&>
            ((CfdSourceLocation *)((long)&hdkey_top.field_2 + 8),"key_info_ = {}",&this->key_info_);
  ::std::__cxx11::string::string(local_70);
  uVar4 = ::std::__cxx11::string::size();
  if (4 < uVar4) {
    ::std::__cxx11::string::substr((ulong)local_90,(ulong)&this->key_info_);
    ::std::__cxx11::string::operator=(local_70,local_90);
    ::std::__cxx11::string::~string(local_90);
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                            (char *)in_stack_fffffffffffff808);
  if (!bVar1) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                              (char *)in_stack_fffffffffffff808);
    CVar10 = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
    if (!bVar1) {
      this->key_type_ = kDescriptorKeyPublic;
      bVar1 = false;
      Pubkey::Pubkey((Pubkey *)
                     &schnorr_pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&privkey.is_compressed_);
      Privkey::Privkey((Privkey *)
                       &bytes.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      ByteData::ByteData((ByteData *)local_528,&this->key_info_);
      bVar2 = Pubkey::IsValid((ByteData *)local_528);
      if (bVar2) {
        ByteData::ByteData((ByteData *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810)
                           ,&in_stack_fffffffffffff808->data_);
        Pubkey::Pubkey(&local_540,&local_558);
        Pubkey::operator=((Pubkey *)
                          &schnorr_pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,&local_540);
        Pubkey::~Pubkey((Pubkey *)0x4150e8);
        ByteData::~ByteData((ByteData *)0x4150f4);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                                  (char *)in_stack_fffffffffffff808);
        if (bVar2) {
          local_570.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          local_570.filename = local_570.filename + 1;
          local_570.line = 0x4ab;
          local_570.funcname = "AnalyzeKey";
          logger::warn<>(&local_570,"Failed to taproot key. taproot is xonly pubkey only.");
          local_592 = 1;
          uVar9 = __cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_590,"Failed to taproot key. taproot is xonly pubkey only.",&local_591);
          CfdException::CfdException(in_stack_fffffffffffff830,CVar10,in_stack_fffffffffffff820);
          local_592 = 0;
          __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
        Pubkey::GetHex_abi_cxx11_
                  (&local_5b8,
                   (Pubkey *)
                   &schnorr_pubkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::operator=((string *)&this->key_info_,(string *)&local_5b8);
        ::std::__cxx11::string::~string((string *)&local_5b8);
      }
      else {
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                                  (char *)in_stack_fffffffffffff808);
        if ((bVar2) && (sVar8 = ByteData::GetDataSize((ByteData *)local_528), sVar8 == 0x20)) {
          SchnorrPubkey::SchnorrPubkey(&local_5d0,(ByteData *)local_528);
          SchnorrPubkey::operator=((SchnorrPubkey *)&privkey.is_compressed_,&local_5d0);
          SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x4153a3);
          SchnorrPubkey::CreatePubkey(&local_5e8,(SchnorrPubkey *)&privkey.is_compressed_,false);
          Pubkey::operator=((Pubkey *)
                            &schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_5e8);
          Pubkey::~Pubkey((Pubkey *)0x4153e0);
          this->key_type_ = kDescriptorKeySchnorr;
          SchnorrPubkey::GetHex_abi_cxx11_
                    ((string *)&except,(SchnorrPubkey *)&privkey.is_compressed_);
          ::std::__cxx11::string::operator=((string *)&this->key_info_,(string *)&except);
          ::std::__cxx11::string::~string((string *)&except);
        }
        else {
          bVar1 = true;
        }
      }
      ByteData::~ByteData((ByteData *)0x415440);
      if (bVar1) {
        local_632 = true;
        local_638 = kMainnet;
        local_639 = Privkey::HasWif(&this->key_info_,&local_638,&local_632);
        if ((bool)local_639) {
          Privkey::FromWif(&local_660,&this->key_info_,local_638,(bool)(local_632 & 1));
          Privkey::operator=((Privkey *)
                             CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                             in_stack_fffffffffffff808);
          Privkey::~Privkey((Privkey *)0x41564b);
        }
        bVar1 = Privkey::IsValid((Privkey *)
                                 &bytes.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) {
          local_678.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          local_678.filename = local_678.filename + 1;
          local_678.line = 0x4ce;
          local_678.funcname = "AnalyzeKey";
          logger::warn<>(&local_678,"Failed to privkey.");
          local_69a = 1;
          uVar9 = __cxa_allocate_exception(0x30);
          this_01 = (CfdException *)local_699;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)(local_699 + 1),"privkey invalid.",(allocator *)this_01);
          CfdException::CfdException
                    (this_01,(CfdError)((ulong)uVar9 >> 0x20),in_stack_fffffffffffff820);
          local_69a = 0;
          __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
        Privkey::GeneratePubkey
                  (&local_6b8,
                   (Privkey *)
                   &bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(bool)(local_632 & 1));
        this_00 = &schnorr_pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        Pubkey::operator=((Pubkey *)this_00,&local_6b8);
        Pubkey::~Pubkey((Pubkey *)0x415817);
        Pubkey::GetHex_abi_cxx11_(&local_6d8,(Pubkey *)this_00);
        ::std::__cxx11::string::operator=((string *)&this->key_info_,(string *)&local_6d8);
        ::std::__cxx11::string::~string((string *)&local_6d8);
      }
      bVar1 = Pubkey::IsCompress((Pubkey *)
                                 &schnorr_pubkey.data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this->is_uncompressed_key_ = (bool)((bVar1 ^ 0xffU) & 1);
      Privkey::~Privkey((Privkey *)0x415885);
      SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x415891);
      Pubkey::~Pubkey((Pubkey *)0x41589d);
      goto LAB_004158c5;
    }
  }
  this->key_type_ = kDescriptorKeyBip32;
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                            (char *)in_stack_fffffffffffff808);
  if (bVar1) {
    this->key_type_ = kDescriptorKeyBip32Priv;
  }
  ExtPubkey::ExtPubkey((ExtPubkey *)((long)&path.field_2 + 8));
  ::std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_150);
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_190,"/",(allocator *)((long)&index + 7));
  StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_170,(string *)&this->key_info_,(string *)local_190);
  ::std::__cxx11::string::~string(local_190);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
  pvVar5 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_170,0);
  ::std::__cxx11::string::operator=((string *)local_150,(string *)pvVar5);
  sVar6 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_170);
  CVar10 = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
  if (1 < sVar6) {
    lVar7 = ::std::__cxx11::string::find((char *)&this->key_info_,0x85bd59);
    if (lVar7 != -1) {
      this->need_arg_num_ = 1;
    }
    local_1a0 = 1;
    while( true ) {
      uVar4 = local_1a0;
      sVar6 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_170);
      CVar10 = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
      if (sVar6 <= uVar4) break;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_170,local_1a0);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                                (char *)in_stack_fffffffffffff808);
      CVar10 = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
      if (bVar1) break;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_170,local_1a0);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                                (char *)in_stack_fffffffffffff808);
      CVar10 = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
      if (bVar1) {
LAB_00414982:
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        break;
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_170,local_1a0);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                                (char *)in_stack_fffffffffffff808);
      CVar10 = (CfdError)((ulong)in_stack_fffffffffffff828 >> 0x20);
      if (bVar1) goto LAB_00414982;
      if (local_1a0 != 1) {
        ::std::__cxx11::string::operator+=((string *)(key.field_2._M_local_buf + 8),"/");
      }
      pvVar5 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_170,local_1a0);
      ::std::__cxx11::string::operator+=((string *)(key.field_2._M_local_buf + 8),(string *)pvVar5);
      local_1a0 = local_1a0 + 1;
    }
    uVar4 = local_1a0 + 1;
    sVar6 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_170);
    if (uVar4 < sVar6) {
      local_1b8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_1b8.filename = local_1b8.filename + 1;
      local_1b8.line = 0x480;
      local_1b8.funcname = "AnalyzeKey";
      logger::warn<>(&local_1b8,"Failed to extkey path. A \'*\' can only be specified at the end.");
      uVar9 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1d8,"Failed to extkey path. A \'*\' can only be specified at the end.",
                 &local_1d9);
      CfdException::CfdException(in_stack_fffffffffffff830,CVar10,in_stack_fffffffffffff820);
      __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  pcVar3 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
  xpriv.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pcVar3 + 1);
  logger::info<std::__cxx11::string&,std::__cxx11::string&>
            ((CfdSourceLocation *)
             &xpriv.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"key = {}, path = {}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&key.field_2 + 8));
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_270,(string *)local_150);
    ::std::__cxx11::string::operator=((string *)&this->base_extkey_,(string *)local_150);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      ExtPrivkey::DerivePrivkey
                (&local_2e8,(ExtPrivkey *)local_270,(string *)((long)&key.field_2 + 8));
      ExtPrivkey::operator=((ExtPrivkey *)local_270,&local_2e8);
      ExtPrivkey::~ExtPrivkey
                ((ExtPrivkey *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    }
    ExtPrivkey::ToString_abi_cxx11_(&local_308,(ExtPrivkey *)local_270);
    ::std::__cxx11::string::operator=((string *)&this->key_info_,(string *)&local_308);
    ::std::__cxx11::string::~string((string *)&local_308);
    ExtPrivkey::GetPubTweakSum(&local_340,(ExtPrivkey *)local_270);
    ByteData256::GetHex_abi_cxx11_(&local_328,&local_340);
    ::std::__cxx11::string::operator=((string *)&this->tweak_sum_,(string *)&local_328);
    ::std::__cxx11::string::~string((string *)&local_328);
    ByteData256::~ByteData256((ByteData256 *)0x414cdc);
    ExtPrivkey::~ExtPrivkey
              ((ExtPrivkey *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
  }
  else {
    if ((list.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      local_358.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_358.filename = local_358.filename + 1;
      local_358.line = 0x492;
      local_358.funcname = "AnalyzeKey";
      logger::warn<>(&local_358,"Failed to extPubkey. hardened is extPrivkey only.");
      local_37a = 1;
      uVar9 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_378,"Failed to extPubkey. hardened is extPrivkey only.",&local_379);
      CfdException::CfdException(in_stack_fffffffffffff830,CVar10,in_stack_fffffffffffff820);
      local_37a = 0;
      __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ExtPubkey::ExtPubkey(&local_3f0,(string *)local_150);
    ExtPubkey::operator=((ExtPubkey *)((long)&path.field_2 + 8),&local_3f0);
    ExtPubkey::~ExtPubkey
              ((ExtPubkey *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    ::std::__cxx11::string::operator=((string *)&this->base_extkey_,(string *)local_150);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      ExtPubkey::DerivePubkey
                (&local_460,(ExtPubkey *)((long)&path.field_2 + 8),
                 (string *)((long)&key.field_2 + 8));
      ExtPubkey::operator=((ExtPubkey *)((long)&path.field_2 + 8),&local_460);
      ExtPubkey::~ExtPubkey
                ((ExtPubkey *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    }
    ExtPubkey::ToString_abi_cxx11_(&local_480,(ExtPubkey *)((long)&path.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)&this->key_info_,(string *)&local_480);
    ::std::__cxx11::string::~string((string *)&local_480);
    ExtPubkey::GetPubTweakSum((ByteData256 *)local_4b8,(ExtPubkey *)((long)&path.field_2 + 8));
    ByteData256::GetHex_abi_cxx11_(&local_4a0,(ByteData256 *)local_4b8);
    ::std::__cxx11::string::operator=((string *)&this->tweak_sum_,(string *)&local_4a0);
    ::std::__cxx11::string::~string((string *)&local_4a0);
    ByteData256::~ByteData256((ByteData256 *)0x414f8c);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff820);
  ::std::__cxx11::string::~string((string *)local_150);
  ::std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  ExtPubkey::~ExtPubkey((ExtPubkey *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
LAB_004158c5:
  local_6f0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  local_6f0.filename = local_6f0.filename + 1;
  local_6f0.line = 0x4d7;
  local_6f0.funcname = "AnalyzeKey";
  logger::info<std::__cxx11::string&>(&local_6f0,"key_info = {}",&this->key_info_);
  ::std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void DescriptorNode::AnalyzeKey() {
  // key analyze
  key_info_ = value_;
  if (value_[0] == '[') {
    // key origin information check
    // cut to ']'
    auto pos = value_.find("]");
    if (pos != std::string::npos) {
      key_info_ = value_.substr(pos + 1);
    }
  }
  // derive key check (xpub,etc)
  info(CFD_LOG_SOURCE, "key_info_ = {}", key_info_);
  std::string hdkey_top;
  if (key_info_.size() > 4) {
    hdkey_top = key_info_.substr(1, 3);
  }
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
    }
    ExtPubkey xpub;
    std::string path;
    std::string key;
    bool hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info_, "/");
    key = list[0];
    if (list.size() > 1) {
      if (key_info_.find("*") != std::string::npos) {
        need_arg_num_ = 1;
      }
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h")) {
          hardened = true;
          break;
        }
        if (index != 1) {
          path += "/";
        }
        path += list[index];
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
    }
    info(CFD_LOG_SOURCE, "key = {}, path = {}", key, path);
    if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
      ExtPrivkey xpriv(key);
      base_extkey_ = key;
      if (!path.empty()) xpriv = xpriv.DerivePrivkey(path);
      key_info_ = xpriv.ToString();
      tweak_sum_ = xpriv.GetPubTweakSum().GetHex();
    } else if (hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      xpub = ExtPubkey(key);
      base_extkey_ = key;
      if (!path.empty()) xpub = xpub.DerivePubkey(path);
      key_info_ = xpub.ToString();
      tweak_sum_ = xpub.GetPubTweakSum().GetHex();
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    Pubkey pubkey;
    SchnorrPubkey schnorr_pubkey;
    Privkey privkey;
    try {
      // pubkey format check
      ByteData bytes(key_info_);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey = Pubkey(bytes);
        if (parent_kind_ == "tr") {
          warn(
              CFD_LOG_SOURCE,
              "Failed to taproot key. taproot is xonly pubkey only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to taproot key. taproot is xonly pubkey only.");
        }
        key_info_ = pubkey.GetHex();
      } else if (
          (parent_kind_ == "tr") &&
          (bytes.GetDataSize() == SchnorrPubkey::kSchnorrPubkeySize)) {
        // xonly pubkey
        schnorr_pubkey = SchnorrPubkey(bytes);
        pubkey = schnorr_pubkey.CreatePubkey();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
        key_info_ = schnorr_pubkey.GetHex();
      } else {
        is_wif = true;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (errmsg.find("hex to byte convert error.") != std::string::npos) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      // privkey WIF check
      bool is_compressed = true;
      NetType nettype = NetType::kMainnet;
      bool has_wif = Privkey::HasWif(key_info_, &nettype, &is_compressed);
      if (has_wif) {
        privkey = Privkey::FromWif(key_info_, nettype, is_compressed);
      }
      if (!privkey.IsValid()) {
        warn(CFD_LOG_SOURCE, "Failed to privkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "privkey invalid.");
      }
      pubkey = privkey.GeneratePubkey(is_compressed);
      key_info_ = pubkey.GetHex();
    }
    is_uncompressed_key_ = !pubkey.IsCompress();
  }
  info(CFD_LOG_SOURCE, "key_info = {}", key_info_);
}